

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

bool __thiscall DnsStats::IsNumericDomain(DnsStats *this,uint8_t *tld,uint32_t length)

{
  ulong uVar1;
  ulong uVar2;
  
  if (length == 0) {
    return true;
  }
  if ((byte)(*tld - 0x3a) < 0xf6) {
    return false;
  }
  uVar1 = 1;
  do {
    uVar2 = uVar1;
    if (length == uVar2) break;
    uVar1 = uVar2 + 1;
  } while (0xf5 < (byte)(tld[uVar2] - 0x3a));
  return length <= uVar2;
}

Assistant:

bool DnsStats::IsNumericDomain(uint8_t * tld, uint32_t length)
{
    bool ret = true;

    for (uint32_t i = 0; i < length; i++)
    {
        if (tld[i] < '0' || tld[i] > '9')
        {
            ret = false;
            break;
        }
    }

    return ret;
}